

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_html_declaration
              (MD_CTX *ctx,MD_LINE *lines,MD_SIZE n_lines,MD_OFFSET beg,MD_OFFSET max_end,
              MD_OFFSET *p_end)

{
  bool bVar1;
  uint uVar2;
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  MD_CHAR *in_R9;
  MD_OFFSET *unaff_retaddr;
  MD_OFFSET off;
  MD_LINE *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if (in_ECX + 2U < *(uint *)(in_RSI + 4)) {
    if (*(char *)(*in_RDI + (ulong)(in_ECX + 1)) == '!') {
      uVar2 = in_ECX + 2;
      if ((uVar2 < *(uint *)(in_RSI + 4)) &&
         (((0x40 < *(byte *)(*in_RDI + (ulong)uVar2) && (*(byte *)(*in_RDI + (ulong)uVar2) < 0x5b))
          || ((0x60 < *(byte *)(*in_RDI + (ulong)uVar2) &&
              (*(byte *)(*in_RDI + (ulong)uVar2) < 0x7b)))))) {
        uVar2 = in_ECX + 3;
        while( true ) {
          bVar1 = false;
          if ((uVar2 < *(uint *)(in_RSI + 4)) &&
             (((*(byte *)(*in_RDI + (ulong)uVar2) < 0x41 ||
               (bVar1 = true, 0x5a < *(byte *)(*in_RDI + (ulong)uVar2))) &&
              (bVar1 = false, 0x60 < *(byte *)(*in_RDI + (ulong)uVar2))))) {
            bVar1 = *(byte *)(*in_RDI + (ulong)uVar2) < 0x7b;
          }
          if (!bVar1) break;
          uVar2 = uVar2 + 1;
        }
        iVar3 = md_scan_for_html_closer
                          ((MD_CTX *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_R9,uVar2,
                           in_stack_ffffffffffffffc0,(MD_SIZE)((ulong)(in_RDI + 0x40) >> 0x20),
                           (MD_OFFSET)(in_RDI + 0x40),(MD_OFFSET)in_RDI,
                           (MD_OFFSET *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           unaff_retaddr);
      }
      else {
        iVar3 = 0;
      }
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
md_is_html_declaration(MD_CTX* ctx, const MD_LINE* lines, MD_SIZE n_lines, OFF beg, OFF max_end, OFF* p_end)
{
    OFF off = beg;

    if(off + 2 >= lines[0].end)
        return FALSE;
    if(CH(off+1) != _T('!'))
        return FALSE;
    off += 2;

    /* Declaration name. */
    if(off >= lines[0].end  ||  !ISALPHA(off))
        return FALSE;
    off++;
    while(off < lines[0].end  &&  ISALPHA(off))
        off++;

    return md_scan_for_html_closer(ctx, _T(">"), 1,
                lines, n_lines, off, max_end, p_end, &ctx->html_decl_horizon);
}